

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  FuncModuleField *pFVar1;
  Location local_a0;
  Var local_80;
  FuncModuleField *local_38;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_30;
  
  GetLocation(&local_80.loc,this);
  MakeUnique<wabt::FuncModuleField,wabt::Location>((wabt *)&local_38,&local_80.loc);
  pFVar1 = local_38;
  (local_38->func).decl.has_func_type = true;
  GetLocation(&local_a0,this);
  Var::Var(&local_80,sig_index,&local_a0);
  Var::operator=(&(pFVar1->func).decl.type_var,&local_80);
  Var::~Var(&local_80);
  FuncSignature::operator=
            (&(pFVar1->func).decl.sig,
             &(this->module_->func_types).
              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
              super__Vector_impl_data._M_start[sig_index]->sig);
  local_30._M_head_impl = local_38;
  local_38 = (FuncModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&local_30);
  if (local_30._M_head_impl != (FuncModuleField *)0x0) {
    (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_30._M_head_impl = (FuncModuleField *)0x0;
  if (local_38 != (FuncModuleField *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = MakeUnique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  func.decl.has_func_type = true;
  func.decl.type_var = Var(sig_index, GetLocation());
  func.decl.sig = module_->func_types[sig_index]->sig;
  module_->AppendField(std::move(field));
  return Result::Ok;
}